

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
::try_emplace_impl<unsigned_long_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,unsigned_long *k)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_00;
  pair<unsigned_long,_bool> pVar6;
  tuple<> local_39;
  tuple<const_unsigned_long_&> local_38;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *k;
  sVar5 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,8) +
          SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar4,0);
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)((ulong)((((uint)(sVar5 >> 0x18) & 0xff ^
                         (uint)(sVar5 >> 0x10) & 0xffff ^ (uint)(sVar5 >> 8) & 0xffffff) & 0xf) *
                       0x30) + (long)this);
  pVar6 = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find_or_prepare_insert<unsigned_long>(this_00,k,sVar5);
  sVar5 = pVar6.first;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_38.super__Tuple_impl<0UL,_const_unsigned_long_&>.
    super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_unsigned_long_&>)(_Tuple_impl<0UL,_const_unsigned_long_&>)k;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
              ((raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,unsigned_long>,std::hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                *)this_00,sVar5,(piecewise_construct_t *)&std::piecewise_construct,&local_38,
               &local_39);
  }
  pcVar1 = this_00->ctrl_;
  psVar2 = this_00->slots_;
  sVar3 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)((long)this + 0x300);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar1 + sVar5;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar2 + sVar5;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar1 + sVar3;
  __return_storage_ptr__->second = pVar6.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        typename Lockable::UniqueLock m;
        auto res = this->find_or_prepare_insert(k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res))
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }